

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

void __thiscall
ON_SubDEdgePtr::SetRelativeSharpness(ON_SubDEdgePtr *this,ON_SubDEdgeSharpness relative_sharpness)

{
  ON_SubDEdgeSharpness sharpness;
  ON_SubDEdge *this_00;
  
  this_00 = (ON_SubDEdge *)(this->m_ptr & 0xfffffffffffffff8);
  if (this_00 == (ON_SubDEdge *)0x0) {
    return;
  }
  if ((this->m_ptr & 1) != 0) {
    sharpness.m_edge_sharpness[1] = relative_sharpness.m_edge_sharpness[0];
    sharpness.m_edge_sharpness[0] = relative_sharpness.m_edge_sharpness[1];
    ON_SubDEdge::SetSharpnessForExperts(this_00,sharpness);
    return;
  }
  ON_SubDEdge::SetSharpnessForExperts(this_00,relative_sharpness);
  return;
}

Assistant:

void ON_SubDEdgePtr::SetRelativeSharpness(ON_SubDEdgeSharpness relative_sharpness) const
{
  ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
  if (nullptr != edge)
    edge->SetSharpnessForExperts(
      (0 == ON_SUBD_EDGE_DIRECTION(m_ptr))
      ? relative_sharpness 
      : relative_sharpness.Reversed()
    );
}